

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

void Curl_shutdown_start(Curl_easy *data,int sockindex,curltime *nowp)

{
  curltime *pcVar1;
  uint local_44;
  undefined1 local_30 [8];
  curltime now;
  curltime *nowp_local;
  int sockindex_local;
  Curl_easy *data_local;
  
  now._8_8_ = nowp;
  if (nowp == (curltime *)0x0) {
    Curl_now();
    now._8_8_ = local_30;
  }
  pcVar1 = (data->conn->shutdown).start + sockindex;
  pcVar1->tv_sec = *(time_t *)now._8_8_;
  *(undefined8 *)&pcVar1->tv_usec = *(undefined8 *)(now._8_8_ + 8);
  if ((data->set).shutdowntimeout == 0) {
    local_44 = 2000;
  }
  else {
    local_44 = (data->set).shutdowntimeout;
  }
  (data->conn->shutdown).timeout_ms = local_44;
  return;
}

Assistant:

void Curl_shutdown_start(struct Curl_easy *data, int sockindex,
                         struct curltime *nowp)
{
  struct curltime now;

  DEBUGASSERT(data->conn);
  if(!nowp) {
    now = Curl_now();
    nowp = &now;
  }
  data->conn->shutdown.start[sockindex] = *nowp;
  data->conn->shutdown.timeout_ms = (data->set.shutdowntimeout > 0) ?
    data->set.shutdowntimeout : DEFAULT_SHUTDOWN_TIMEOUT_MS;
}